

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClockingDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingDeclarationSyntax,slang::syntax::ClockingDeclarationSyntax_const&>
          (BumpAllocator *this,ClockingDeclarationSyntax *args)

{
  ClockingDeclarationSyntax *pCVar1;
  ClockingDeclarationSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pCVar1 = (ClockingDeclarationSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::ClockingDeclarationSyntax::ClockingDeclarationSyntax(in_RSI,pCVar1);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }